

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O2

int Cloak_on(void)

{
  ushort uVar1;
  uint uVar2;
  boolean bVar3;
  char *pcVar4;
  char *line;
  
  if (uarmc == (obj *)0x0) {
    return 0;
  }
  uVar2 = u.uprops[objects[uarmc->otyp].oc_oprop].extrinsic;
  Oprops_on(uarmc,2);
  uVar1 = uarmc->otyp;
  switch(uVar1) {
  case 0x7c:
    if ((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
        (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001820f3;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001820ee;
LAB_001821d3:
        newsym((int)u.ux,(int)u.uy);
        if (u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) {
          pcVar4 = "no longer see through yourself";
          if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
            pcVar4 = "see yourself";
          }
        }
        else {
          pcVar4 = "no longer see through yourself";
        }
        line = "You can %s!";
        goto LAB_00182114;
      }
LAB_001820ee:
      if (ublindf != (obj *)0x0) {
LAB_001820f3:
        if (ublindf->oartifact == '\x1d') goto LAB_001821d3;
      }
    }
    break;
  case 0x7d:
    if ((((uVar2 & 0xfffffffd) == 0) && (u.uprops[0x13].intrinsic == 0)) &&
       (u.uprops[0x13].blocked == 0)) {
      discover_object(0x7d,'\x01','\x01');
      pline("You move very quietly.");
    }
    break;
  case 0x7e:
  case 0x7f:
  case 0x81:
  case 0x83:
  case 0x86:
    goto switchD_00181fee_caseD_7e;
  case 0x80:
    pcVar4 = Tobjnam(uarmc,"fit");
    line = "%s very tightly.";
LAB_00182114:
    pline(line,pcVar4);
    break;
  case 0x82:
    u.uprops[7].extrinsic._0_1_ = (byte)u.uprops[7].extrinsic | 2;
    break;
  case 0x84:
  case 0x87:
    discover_object((uint)uVar1,'\x01','\x01');
    break;
  case 0x85:
    if ((uVar2 & 0xfffffffd) == 0 && u.uprops[0xd].intrinsic == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00182082;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00182079;
LAB_00182186:
        discover_object(0x85,'\x01','\x01');
        newsym((int)u.ux,(int)u.uy);
        if (u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) {
          pcVar4 = " see through";
          if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
            pcVar4 = "not see";
          }
        }
        else {
          pcVar4 = " see through";
        }
        line = "Suddenly you can%s yourself.";
        goto LAB_00182114;
      }
LAB_00182079:
      if (ublindf != (obj *)0x0) {
LAB_00182082:
        if (ublindf->oartifact == '\x1d') goto LAB_00182186;
      }
    }
    break;
  default:
    warning("Unknown type of %s (%d)","cloak",(ulong)(uint)(int)(short)uVar1);
  }
  if (uarmc != (obj *)0x0) {
switchD_00181fee_caseD_7e:
    bVar3 = is_racial_armor(uarmc,&youmonst);
    if (bVar3 == '\0') {
      u.uconduct.unracearmor = u.uconduct.unracearmor + 1;
    }
  }
  return 0;
}

Assistant:

static int Cloak_on(void)
{
    long oldprop;

    if (!uarmc) return 0;

    oldprop = u.uprops[objects[uarmc->otyp].oc_oprop].extrinsic & ~WORN_CLOAK;

    Oprops_on(uarmc, WORN_CLOAK);

    switch(uarmc->otyp) {
	case CLOAK_OF_PROTECTION:
	case CLOAK_OF_DISPLACEMENT:
		makeknown(uarmc->otyp);
		break;
	case ORCISH_CLOAK:
	case DWARVISH_CLOAK:
	case CLOAK_OF_MAGIC_RESISTANCE:
	case ROBE:
	case LEATHER_CLOAK:
		break;
	case ELVEN_CLOAK:
		if (!oldprop && !HStealth && !BStealth) {
		    makeknown(uarmc->otyp);
		    pline("You move very quietly.");
		}
		break;
	case MUMMY_WRAPPING:
		/* Note: it's already being worn, so we have to cheat here. */
		if ((HInvis || EInvis || pm_invisible(youmonst.data)) && !Blind) {
		    newsym(u.ux,u.uy);
		    pline("You can %s!",
			See_invisible ? "no longer see through yourself"
			: see_yourself);
		}
		break;
	case CLOAK_OF_INVISIBILITY:
		/* since cloak of invisibility was worn, we know mummy wrapping
		   wasn't, so no need to check `oldprop' against blocked */
		if (!oldprop && !HInvis && !Blind) {
		    makeknown(uarmc->otyp);
		    newsym(u.ux,u.uy);
		    pline("Suddenly you can%s yourself.",
			See_invisible ? " see through" : "not see");
		}
		break;
	case OILSKIN_CLOAK:
		pline("%s very tightly.", Tobjnam(uarmc, "fit"));
		break;
	/* Alchemy smock gives poison _and_ acid resistance */
	case ALCHEMY_SMOCK:
		EAcid_resistance |= WORN_CLOAK;
		break;
	default: warning(unknown_type, c_cloak, uarmc->otyp);
    }

    if (uarmc && !is_racial_armor(uarmc, &youmonst))
	u.uconduct.unracearmor++;

    /* discover_cursed_equip() called by dowear() */

    return 0;
}